

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O3

REF_STATUS ref_phys_u_tau(REF_DBL y,REF_DBL u,REF_DBL nu_mach_re,REF_DBL *u_tau)

{
  uint uVar1;
  REF_STATUS RVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar11 [16];
  double dVar12;
  REF_DBL uplus_error;
  double local_80;
  double local_78;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  double local_38;
  double local_28;
  
  local_68 = u;
  if (u <= -u) {
    local_68 = -u;
  }
  local_78 = y;
  if (y <= -y) {
    local_78 = -y;
  }
  auVar8._0_8_ = local_78 * 1e+20;
  auVar8._8_8_ = local_68;
  auVar9._8_8_ = -local_68;
  auVar9._0_8_ = -auVar8._0_8_;
  auVar9 = maxpd(auVar8,auVar9);
  if (auVar9._0_8_ <= auVar9._8_8_) {
    *u_tau = nu_mach_re;
LAB_0019d254:
    RVar2 = 0;
  }
  else {
    dVar6 = (local_68 / local_78) * nu_mach_re;
    uStack_60 = in_XMM1_Qb;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    if (dVar6 <= local_68 / 30.0) {
      dVar6 = local_68 / 30.0;
    }
    *u_tau = dVar6;
    local_28 = local_78 / nu_mach_re;
    bVar5 = true;
    iVar3 = 100;
    do {
      if (!bVar5) goto LAB_0019d254;
      local_38 = (local_78 * dVar6) / nu_mach_re;
      uVar1 = ref_phys_spalding_uplus(local_38,&local_80);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x2da,"ref_phys_u_tau",(ulong)uVar1,"uplus");
        goto LAB_0019d48d;
      }
      local_58 = local_68 / dVar6;
      uStack_50 = uStack_60;
      local_80 = local_80 - local_58;
      uStack_40 = 0;
      local_48 = local_80;
      dVar7 = exp(local_58 * 0.4);
      dVar6 = *u_tau - local_48 /
                       (local_68 / (dVar6 * dVar6) +
                       local_28 / ((dVar7 * 0.4 + -0.4) * 0.1108 + 1.0));
      *u_tau = dVar6;
      auVar11._0_8_ = local_58 * 1e+20;
      auVar11._8_8_ = local_48;
      auVar10._0_8_ = -auVar11._0_8_;
      auVar10._8_8_ = -local_48;
      auVar9 = maxpd(auVar11,auVar10);
      dVar7 = auVar9._8_8_;
      if (auVar9._0_8_ <= dVar7) {
LAB_0019d3e6:
        bVar5 = dVar7 == 1e-15;
        bVar4 = dVar7 < 1e-15;
      }
      else {
        dVar12 = local_58;
        if (local_58 <= -local_58) {
          dVar12 = -local_58;
        }
        if (dVar12 <= 0.001) goto LAB_0019d3e6;
        dVar7 = local_48 / local_58;
        if (dVar7 <= -dVar7) {
          dVar7 = -dVar7;
        }
        bVar5 = dVar7 == 1e-12;
        bVar4 = dVar7 < 1e-12;
      }
      bVar5 = !bVar4 && !bVar5;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x2ef,
           "ref_phys_u_tau","iteration count exceeded");
    printf(" y %e u %e yplus %e uplus %e error %e u_tau %e\n",local_78,local_68,local_38,local_58,
           local_48,*u_tau);
LAB_0019d48d:
    RVar2 = 1;
  }
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_phys_u_tau(REF_DBL y, REF_DBL u, REF_DBL nu_mach_re,
                                  REF_DBL *u_tau) {
  REF_DBL uplus, yplus;
  REF_DBL uplus_error;
  REF_DBL dyplus_duplus;
  REF_DBL uplus_error_du_tau;
  REF_DBL duplus_du_tau, dyplus_du_tau;
  REF_DBL du_tau;
  REF_BOOL keep_going;
  REF_INT iters;
  REF_BOOL verbose = REF_FALSE;
  u = ABS(u); /* only admit positive values */
  y = ABS(y);
  if (!ref_math_divisible(u, y)) {
    *u_tau = nu_mach_re;
    if (verbose) {
      uplus = u / (*u_tau);
      yplus = y * (*u_tau) / nu_mach_re;
      uplus_error = 0.0;
      printf("u_tau %e yplus %f uplus %f error %e y %e\n", *u_tau, yplus, uplus,
             uplus_error, y);
    }
    return REF_SUCCESS;
  }
  *u_tau = sqrt(u / y * nu_mach_re); /* guess to start newton */
  uplus = 30;                        /* edge of boundary layer guess */
  (*u_tau) = MAX((*u_tau), (u / uplus));
  iters = 0;
  keep_going = REF_TRUE;
  while (keep_going) {
    uplus = u / (*u_tau);
    duplus_du_tau = -u / ((*u_tau) * (*u_tau));
    yplus = y * (*u_tau) / nu_mach_re;
    dyplus_du_tau = y / nu_mach_re;
    RSS(ref_phys_spalding_uplus(yplus, &uplus_error), "uplus");
    uplus_error -= uplus;
    RSS(ref_phys_spalding_dyplus_duplus(uplus, &dyplus_duplus),
        "dyplus_duplus");
    uplus_error_du_tau = dyplus_du_tau / dyplus_duplus - duplus_du_tau;
    du_tau = -uplus_error / uplus_error_du_tau;
    if (verbose)
      printf("u_tau %f yplus %f uplus %f error %e y %e\n", *u_tau, yplus, uplus,
             uplus_error, y);
    (*u_tau) += du_tau;

    if (ref_math_divisible(uplus_error, uplus) && ABS(uplus) > 1.0e-3) {
      keep_going = (ABS(uplus_error / uplus) > 1.0e-12);
    } else {
      keep_going = (ABS(uplus_error) > 1.0e-15);
    }

    iters++;
    RAB(iters < 100, "iteration count exceeded", {
      printf(" y %e u %e yplus %e uplus %e error %e u_tau %e\n", y, u, yplus,
             uplus, uplus_error, *u_tau);
    });
  }
  return REF_SUCCESS;
}